

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

int Cec_ManSimClassesPrepare(Cec_ManSim_t *p,int LevelMax)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  int *piVar3;
  ulong uVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  long lVar7;
  Cec_ParSim_t *pCVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  Vec_Int_t *pVVar14;
  bool bVar15;
  
  pGVar5 = p->pAig;
  if (pGVar5->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                  ,0x357,"int Cec_ManSimClassesPrepare(Cec_ManSim_t *, int)");
  }
  iVar9 = pGVar5->nObjs;
  pGVar2 = (Gia_Rpr_t *)calloc((long)iVar9,4);
  pGVar5->pReprs = pGVar2;
  piVar3 = (int *)calloc((long)iVar9,4);
  pGVar5->pNexts = piVar3;
  Gia_ManCreateValueRefs(pGVar5);
  if (p->pPars->fLatchCorr == 0) {
    pGVar5 = p->pAig;
    if (LevelMax == -1) {
      if (0 < pGVar5->nObjs) {
        lVar7 = 0;
        uVar11 = 0;
        do {
          if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
          uVar12 = *(uint *)(&pGVar5->pObjs->field_0x0 + lVar7);
          bVar15 = (~uVar12 & 0x1fffffff) != 0;
          uVar4 = 0;
          if (!bVar15 || -1 >= (int)uVar12) {
            uVar4 = 0xfffffff;
          }
          if (uVar11 <= uVar4 && (bVar15 && -1 < (int)uVar12)) goto LAB_005cbfaf;
          pGVar5->pReprs[uVar11] =
               (Gia_Rpr_t)((uint)pGVar5->pReprs[uVar11] & 0xf0000000 | (uint)uVar4);
          uVar11 = uVar11 + 1;
          pGVar5 = p->pAig;
          lVar7 = lVar7 + 0xc;
        } while ((long)uVar11 < (long)pGVar5->nObjs);
      }
    }
    else {
      Gia_ManLevelNum(pGVar5);
      pGVar5 = p->pAig;
      if (0 < pGVar5->nObjs) {
        uVar11 = 0;
        do {
          if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
          uVar12 = *(uint *)(pGVar5->pObjs + uVar11);
          if ((int)uVar12 < 0 || (~uVar12 & 0x1fffffff) == 0) {
            uVar4 = 0xfffffff;
          }
          else {
            pVVar14 = pGVar5->vLevels;
            uVar4 = uVar11 + 1;
            iVar9 = pVVar14->nSize;
            uVar13 = (ulong)iVar9;
            if ((long)uVar13 <= (long)uVar11) {
              lVar7 = (long)pVVar14->nCap;
              uVar10 = lVar7 * 2;
              if (SBORROW8(uVar11,uVar10) == (long)(uVar11 + lVar7 * -2) < 0) {
                if (pVVar14->pArray == (int *)0x0) {
                  piVar3 = (int *)malloc(uVar4 * 4);
                }
                else {
                  piVar3 = (int *)realloc(pVVar14->pArray,uVar4 * 4);
                }
                pVVar14->pArray = piVar3;
                uVar10 = uVar4 & 0xffffffff;
LAB_005cbceb:
                if (piVar3 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                pVVar14->nCap = (int)uVar10;
                iVar9 = pVVar14->nSize;
                uVar13 = (ulong)iVar9;
              }
              else if (lVar7 <= (long)uVar11) {
                if (pVVar14->pArray == (int *)0x0) {
                  piVar3 = (int *)malloc(lVar7 << 3);
                }
                else {
                  piVar3 = (int *)realloc(pVVar14->pArray,lVar7 << 3);
                }
                pVVar14->pArray = piVar3;
                goto LAB_005cbceb;
              }
              if ((long)uVar13 <= (long)uVar11) {
                memset(pVVar14->pArray + uVar13,0,(ulong)(uint)((int)uVar11 - iVar9) * 4 + 4);
              }
              pVVar14->nSize = (int)uVar4;
              uVar13 = uVar4;
            }
            if ((long)uVar13 <= (long)uVar11) goto LAB_005cbf90;
            uVar4 = 0;
            if (LevelMax < pVVar14->pArray[uVar11]) {
              uVar4 = 0xfffffff;
            }
            if (uVar11 <= uVar4 && pVVar14->pArray[uVar11] <= LevelMax) goto LAB_005cbfaf;
          }
          uVar13 = uVar11 + 1;
          pGVar5->pReprs[uVar11] =
               (Gia_Rpr_t)((uint)pGVar5->pReprs[uVar11] & 0xf0000000 | (uint)uVar4);
          pGVar5 = p->pAig;
          uVar11 = uVar13;
        } while ((long)uVar13 < (long)pGVar5->nObjs);
      }
      pVVar14 = pGVar5->vLevels;
      if (pVVar14 != (Vec_Int_t *)0x0) {
        if (pVVar14->pArray != (int *)0x0) {
          free(pVVar14->pArray);
          pGVar5->vLevels->pArray = (int *)0x0;
          pVVar14 = pGVar5->vLevels;
          if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_005cbe4a;
        }
        free(pVVar14);
        pGVar5->vLevels = (Vec_Int_t *)0x0;
      }
    }
  }
  else {
    pGVar5 = p->pAig;
    if (0 < pGVar5->nObjs) {
      lVar7 = 0;
      do {
        if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5->pReprs[lVar7] = (Gia_Rpr_t)((uint)pGVar5->pReprs[lVar7] | 0xfffffff);
        lVar7 = lVar7 + 1;
        pGVar5 = p->pAig;
      } while (lVar7 < pGVar5->nObjs);
    }
  }
LAB_005cbe4a:
  pCVar8 = p->pPars;
  if (pCVar8->fSeqSimulate != 0) {
    pGVar5 = p->pAig;
    iVar9 = pGVar5->nRegs;
    if (0 < iVar9) {
      iVar6 = 0;
      do {
        iVar1 = pGVar5->vCis->nSize;
        uVar12 = (iVar1 - iVar9) + iVar6;
        if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) {
LAB_005cbf90:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = pGVar5->vCis->pArray[uVar12];
        lVar7 = (long)iVar9;
        if ((lVar7 < 0) || (pGVar5->nObjs <= iVar9)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
        if (pGVar5->pObjs[lVar7].Value != 0) {
          if (iVar9 == 0) {
LAB_005cbfaf:
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x3a2,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          pGVar5->pReprs[lVar7] = (Gia_Rpr_t)((uint)pGVar5->pReprs[lVar7] & 0xf0000000);
          pGVar5 = p->pAig;
        }
        iVar6 = iVar6 + 1;
        iVar9 = pGVar5->nRegs;
      } while (iVar6 < iVar9);
      pCVar8 = p->pPars;
    }
  }
  p->nWords = 1;
  do {
    if (pCVar8->fVerbose != 0) {
      Gia_ManEquivPrintClasses
                (p->pAig,0,(float)(pCVar8->nWords + 1) * (float)p->nMemsMax * 9.536743e-07);
    }
    iVar9 = 4;
    do {
      Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
      iVar6 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
      if (iVar6 != 0) {
        return 1;
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
    iVar9 = p->nWords;
    p->nWords = iVar9 * 2 + 1;
    pCVar8 = p->pPars;
  } while (iVar9 * 2 < pCVar8->nWords);
  return 0;
}

Assistant:

int Cec_ManSimClassesPrepare( Cec_ManSim_t * p, int LevelMax )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pAig->pReprs == NULL );
    // allocate representation
    p->pAig->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p->pAig) );
    p->pAig->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    // create references
    Gia_ManCreateValueRefs( p->pAig );
    // set starting representative of internal nodes to be constant 0
    if ( p->pPars->fLatchCorr )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
    else if ( LevelMax == -1 )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjIsAnd(pObj) ? 0 : GIA_VOID );
    else
    {
        Gia_ManLevelNum( p->pAig );
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, (Gia_ObjIsAnd(pObj) && Gia_ObjLevel(p->pAig,pObj) <= LevelMax) ? 0 : GIA_VOID );
        Vec_IntFreeP( &p->pAig->vLevels );
    }
    // if sequential simulation, set starting representative of ROs to be constant 0
    if ( p->pPars->fSeqSimulate )
        Gia_ManForEachRo( p->pAig, pObj, i )
            if ( pObj->Value )
                Gia_ObjSetRepr( p->pAig, Gia_ObjId(p->pAig, pObj), 0 );
    // perform simulation
    p->nWords = 1;
    do {
        if ( p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        for ( i = 0; i < 4; i++ )
        {
            Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
            if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
                return 1;
        }
        p->nWords = 2 * p->nWords + 1;
    }
    while ( p->nWords <= p->pPars->nWords );
    return 0;
}